

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void set_option_info(archive_string *info,int *opt,char *key,keytype type,...)

{
  char cVar1;
  undefined4 in_ECX;
  char *pcVar2;
  undefined8 in_RDX;
  int *in_RSI;
  archive_string *in_RDI;
  int d;
  char *s;
  char prefix;
  va_list ap;
  ulong local_e8;
  
  cVar1 = ',';
  if (*in_RSI == 0) {
    cVar1 = ' ';
  }
  switch(in_ECX) {
  case 0:
    pcVar2 = "";
    if ((int)local_e8 == 0) {
      pcVar2 = "!";
    }
    archive_string_sprintf(in_RDI,"%c%s%s",(ulong)(uint)(int)cVar1,pcVar2,in_RDX);
    break;
  case 1:
    archive_string_sprintf(in_RDI,"%c%s=%s",(ulong)(uint)(int)cVar1,in_RDX,local_e8);
    break;
  case 2:
    archive_string_sprintf(in_RDI,"%c%s=%d",(ulong)(uint)(int)cVar1,in_RDX,local_e8 & 0xffffffff);
    break;
  case 3:
    archive_string_sprintf(in_RDI,"%c%s=%x",(ulong)(uint)(int)cVar1,in_RDX,local_e8 & 0xffffffff);
  }
  *in_RSI = 1;
  return;
}

Assistant:

static void
set_option_info(struct archive_string *info, int *opt, const char *key,
    enum keytype type,  ...)
{
	va_list ap;
	char prefix;
	const char *s;
	int d;

	prefix = (*opt==0)? ' ':',';
	va_start(ap, type);
	switch (type) {
	case KEY_FLG:
		d = va_arg(ap, int);
		archive_string_sprintf(info, "%c%s%s",
		    prefix, (d == 0)?"!":"", key);
		break;
	case KEY_STR:
		s = va_arg(ap, const char *);
		archive_string_sprintf(info, "%c%s=%s",
		    prefix, key, s);
		break;
	case KEY_INT:
		d = va_arg(ap, int);
		archive_string_sprintf(info, "%c%s=%d",
		    prefix, key, d);
		break;
	case KEY_HEX:
		d = va_arg(ap, int);
		archive_string_sprintf(info, "%c%s=%x",
		    prefix, key, d);
		break;
	}
	va_end(ap);

	*opt = 1;
}